

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetWindowPos(ImGuiWindow *window,ImVec2 *pos,ImGuiCond cond)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  
  if (cond != 0) {
    if (((char)window->field_0xaf & cond) == 0) {
      return;
    }
    if ((cond & cond - 1U) != 0) {
      __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x198e,"void ImGui::SetWindowPos(ImGuiWindow *, const ImVec2 &, ImGuiCond)");
    }
  }
  window->field_0xaf = window->field_0xaf & 0xf1;
  (window->SetWindowPosVal).x = 3.4028235e+38;
  (window->SetWindowPosVal).y = 3.4028235e+38;
  fVar3 = (window->Pos).x;
  fVar2 = (window->Pos).y;
  IVar1.y = (float)(int)pos->y;
  IVar1.x = (float)(int)pos->x;
  window->Pos = IVar1;
  fVar3 = (window->Pos).x - fVar3;
  fVar2 = (window->Pos).y - fVar2;
  (window->DC).CursorPos.x = (window->DC).CursorPos.x + fVar3;
  (window->DC).CursorPos.y = (window->DC).CursorPos.y + fVar2;
  (window->DC).CursorMaxPos.x = (window->DC).CursorMaxPos.x + fVar3;
  (window->DC).CursorMaxPos.y = (window->DC).CursorMaxPos.y + fVar2;
  (window->DC).CursorStartPos.x = fVar3 + (window->DC).CursorStartPos.x;
  (window->DC).CursorStartPos.y = fVar2 + (window->DC).CursorStartPos.y;
  return;
}

Assistant:

void ImGui::SetWindowPos(ImGuiWindow* window, const ImVec2& pos, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowPosAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowPosAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);
    window->SetWindowPosVal = ImVec2(FLT_MAX, FLT_MAX);

    // Set
    const ImVec2 old_pos = window->Pos;
    window->Pos = ImFloor(pos);
    ImVec2 offset = window->Pos - old_pos;
    window->DC.CursorPos += offset;         // As we happen to move the window while it is being appended to (which is a bad idea - will smear) let's at least offset the cursor
    window->DC.CursorMaxPos += offset;      // And more importantly we need to offset CursorMaxPos/CursorStartPos this so ContentSize calculation doesn't get affected.
    window->DC.CursorStartPos += offset;
}